

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureFunctionTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::ShaderTextureFunctionInstance::ShaderTextureFunctionInstance
          (ShaderTextureFunctionInstance *this,Context *context,bool isVertexCase,
          ShaderEvaluator *evaluator,UniformSetup *uniformSetup,TextureLookupSpec *lookupSpec,
          TextureSpec *textureSpec,TexLookupParams *lookupParams,ImageBackingMode imageBackingMode)

{
  Vector<float,_4> *this_00;
  bool bVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  byte local_2dd;
  Matrix<float,_4,_4> local_298;
  Matrix<float,_4,_4> local_258;
  float local_218;
  float local_214;
  float gradDyTrans [16];
  float gradDxTrans [16];
  undefined1 local_190 [8];
  Vec3 sy;
  Vec3 sx;
  undefined1 auStack_138 [8];
  float lodCoordTrans [16];
  float b_1;
  float s_1;
  bool isGrad;
  bool hasLodBias;
  float local_a8 [2];
  float baseCoordTrans [16];
  Vec4 b;
  Vec4 s;
  TextureLookupSpec *lookupSpec_local;
  UniformSetup *uniformSetup_local;
  ShaderEvaluator *evaluator_local;
  bool isVertexCase_local;
  Context *context_local;
  ShaderTextureFunctionInstance *this_local;
  
  ShaderRenderCaseInstance::ShaderRenderCaseInstance
            (&this->super_ShaderRenderCaseInstance,context,isVertexCase,evaluator,uniformSetup,
             (AttributeSetupFunc)0x0,imageBackingMode,0);
  (this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__ShaderTextureFunctionInstance_016a9100;
  this->m_lookupSpec = lookupSpec;
  this->m_textureSpec = textureSpec;
  this->m_lookupParams = lookupParams;
  checkDeviceFeatures((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context,
                      this->m_textureSpec->type);
  tcu::operator-((tcu *)(b.m_data + 2),&this->m_lookupSpec->maxCoord,&this->m_lookupSpec->minCoord);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(baseCoordTrans + 0xf),&this->m_lookupSpec->minCoord);
  pfVar3 = b.m_data + 2;
  pfVar2 = tcu::Vector<float,_4>::x((Vector<float,_4> *)pfVar3);
  local_a8[0] = *pfVar2;
  local_a8[1] = 0.0;
  baseCoordTrans[0] = 0.0;
  this_00 = (Vector<float,_4> *)(baseCoordTrans + 0xf);
  pfVar2 = tcu::Vector<float,_4>::x(this_00);
  baseCoordTrans[1] = *pfVar2;
  baseCoordTrans[2] = 0.0;
  pfVar2 = tcu::Vector<float,_4>::y((Vector<float,_4> *)pfVar3);
  baseCoordTrans[3] = *pfVar2;
  baseCoordTrans[4] = 0.0;
  pfVar2 = tcu::Vector<float,_4>::y(this_00);
  baseCoordTrans[5] = *pfVar2;
  pfVar2 = tcu::Vector<float,_4>::z((Vector<float,_4> *)pfVar3);
  baseCoordTrans[6] = *pfVar2 * 0.5;
  pfVar2 = tcu::Vector<float,_4>::z((Vector<float,_4> *)pfVar3);
  baseCoordTrans[7] = -*pfVar2 * 0.5;
  baseCoordTrans[8] = 0.0;
  pfVar2 = tcu::Vector<float,_4>::z((Vector<float,_4> *)pfVar3);
  fVar4 = *pfVar2;
  pfVar2 = tcu::Vector<float,_4>::z(this_00);
  baseCoordTrans[9] = fVar4 * 0.5 + *pfVar2;
  pfVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)pfVar3);
  baseCoordTrans[10] = -*pfVar2 * 0.5;
  pfVar2 = tcu::Vector<float,_4>::w((Vector<float,_4> *)pfVar3);
  baseCoordTrans[0xb] = *pfVar2 * 0.5;
  baseCoordTrans[0xc] = 0.0;
  pfVar3 = tcu::Vector<float,_4>::w((Vector<float,_4> *)pfVar3);
  fVar4 = *pfVar3;
  pfVar3 = tcu::Vector<float,_4>::w(this_00);
  baseCoordTrans[0xd] = fVar4 * 0.5 + *pfVar3;
  tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)&s_1,local_a8);
  std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
            (&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,(value_type *)&s_1);
  tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)&s_1);
  ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,4,A_IN0);
  bVar1 = functionHasLod(this->m_lookupSpec->function);
  local_2dd = 1;
  if (!bVar1) {
    local_2dd = this->m_lookupSpec->useBias;
  }
  bVar1 = functionHasGrad(this->m_lookupSpec->function);
  if ((local_2dd & 1) == 0) {
    if (bVar1) {
      tcu::operator-((tcu *)(sy.m_data + 1),&this->m_lookupSpec->maxDX,&this->m_lookupSpec->minDX);
      tcu::operator-((tcu *)local_190,&this->m_lookupSpec->maxDY,&this->m_lookupSpec->minDY);
      pfVar3 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(sy.m_data + 1));
      gradDyTrans[0xe] = *pfVar3 * 0.5;
      pfVar3 = tcu::Vector<float,_3>::x((Vector<float,_3> *)(sy.m_data + 1));
      gradDyTrans[0xf] = *pfVar3 * 0.5;
      tcu::Vector<float,_3>::x(&this->m_lookupSpec->minDX);
      tcu::Vector<float,_3>::y((Vector<float,_3> *)(sy.m_data + 1));
      tcu::Vector<float,_3>::y((Vector<float,_3> *)(sy.m_data + 1));
      tcu::Vector<float,_3>::y(&this->m_lookupSpec->minDX);
      tcu::Vector<float,_3>::z((Vector<float,_3> *)(sy.m_data + 1));
      tcu::Vector<float,_3>::z((Vector<float,_3> *)(sy.m_data + 1));
      tcu::Vector<float,_3>::z(&this->m_lookupSpec->minDX);
      pfVar3 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_190);
      local_218 = *pfVar3 * -0.5;
      pfVar3 = tcu::Vector<float,_3>::x((Vector<float,_3> *)local_190);
      local_214 = *pfVar3 * -0.5;
      gradDyTrans[0] = 0.0;
      gradDyTrans[1] = tcu::Vector<float,_3>::x(&this->m_lookupSpec->maxDY);
      pfVar3 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_190);
      gradDyTrans[2] = *pfVar3 * -0.5;
      pfVar3 = tcu::Vector<float,_3>::y((Vector<float,_3> *)local_190);
      gradDyTrans[3] = *pfVar3 * -0.5;
      gradDyTrans[4] = 0.0;
      gradDyTrans[5] = tcu::Vector<float,_3>::y(&this->m_lookupSpec->maxDY);
      pfVar3 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_190);
      gradDyTrans[6] = *pfVar3 * -0.5;
      pfVar3 = tcu::Vector<float,_3>::z((Vector<float,_3> *)local_190);
      gradDyTrans[7] = *pfVar3 * -0.5;
      gradDyTrans[8] = 0.0;
      gradDyTrans[9] = tcu::Vector<float,_3>::z(&this->m_lookupSpec->maxDY);
      gradDyTrans[10] = 0.0;
      gradDyTrans[0xb] = 0.0;
      gradDyTrans[0xc] = 0.0;
      gradDyTrans[0xd] = 0.0;
      tcu::Matrix<float,_4,_4>::Matrix(&local_258,gradDyTrans + 0xe);
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                (&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,&local_258);
      tcu::Matrix<float,_4,_4>::~Matrix(&local_258);
      tcu::Matrix<float,_4,_4>::Matrix(&local_298,&local_218);
      std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
                (&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,&local_298);
      tcu::Matrix<float,_4,_4>::~Matrix(&local_298);
      ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,5,A_IN1);
      ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,6,A_IN2);
    }
  }
  else {
    fVar4 = this->m_lookupSpec->maxLodBias - this->m_lookupSpec->minLodBias;
    lodCoordTrans[0xf] = this->m_lookupSpec->minLodBias;
    lodCoordTrans._8_16_ = ZEXT416(0);
    auStack_138._4_4_ = fVar4 * 0.5;
    auStack_138._0_4_ = fVar4 * 0.5;
    lodCoordTrans[0] = 0.0;
    lodCoordTrans[1] = lodCoordTrans[0xf];
    lodCoordTrans._24_16_ = lodCoordTrans._8_16_;
    lodCoordTrans._40_16_ = lodCoordTrans._8_16_;
    tcu::Matrix<float,_4,_4>::Matrix((Matrix<float,_4,_4> *)(sx.m_data + 1),(float *)auStack_138);
    std::vector<tcu::Matrix<float,_4,_4>,_std::allocator<tcu::Matrix<float,_4,_4>_>_>::push_back
              (&(this->super_ShaderRenderCaseInstance).m_userAttribTransforms,
               (value_type *)(sx.m_data + 1));
    tcu::Matrix<float,_4,_4>::~Matrix((Matrix<float,_4,_4> *)(sx.m_data + 1));
    ShaderRenderCaseInstance::useAttribute(&this->super_ShaderRenderCaseInstance,5,A_IN1);
  }
  initTexture(this);
  return;
}

Assistant:

ShaderTextureFunctionInstance::ShaderTextureFunctionInstance (Context&						context,
															  const bool					isVertexCase,
															  const ShaderEvaluator&		evaluator,
															  const UniformSetup&			uniformSetup,
															  const TextureLookupSpec&		lookupSpec,
															  const TextureSpec&			textureSpec,
															  const TexLookupParams&		lookupParams,
															  const ImageBackingMode		imageBackingMode)
	: ShaderRenderCaseInstance	(context, isVertexCase, evaluator, uniformSetup, DE_NULL, imageBackingMode)
	, m_lookupSpec				(lookupSpec)
	, m_textureSpec				(textureSpec)
	, m_lookupParams			(lookupParams)
{
	checkDeviceFeatures(m_context, m_textureSpec.type);

	{
		// Base coord scale & bias
		Vec4 s = m_lookupSpec.maxCoord-m_lookupSpec.minCoord;
		Vec4 b = m_lookupSpec.minCoord;

		float baseCoordTrans[] =
		{
			s.x(),		0.0f,		0.f,	b.x(),
			0.f,		s.y(),		0.f,	b.y(),
			s.z()/2.f,	-s.z()/2.f,	0.f,	s.z()/2.f + b.z(),
			-s.w()/2.f,	s.w()/2.f,	0.f,	s.w()/2.f + b.w()
		};

		m_userAttribTransforms.push_back(tcu::Mat4(baseCoordTrans));

		useAttribute(4u, A_IN0);
	}

	bool hasLodBias	= functionHasLod(m_lookupSpec.function) || m_lookupSpec.useBias;
	bool isGrad		= functionHasGrad(m_lookupSpec.function);
	DE_ASSERT(!isGrad || !hasLodBias);

	if (hasLodBias)
	{
		float s = m_lookupSpec.maxLodBias-m_lookupSpec.minLodBias;
		float b = m_lookupSpec.minLodBias;
		float lodCoordTrans[] =
		{
			s/2.0f,		s/2.0f,		0.f,	b,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f,
			0.0f,		0.0f,		0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(lodCoordTrans));

		useAttribute(5u, A_IN1);
	}
	else if (isGrad)
	{
		Vec3 sx = m_lookupSpec.maxDX-m_lookupSpec.minDX;
		Vec3 sy = m_lookupSpec.maxDY-m_lookupSpec.minDY;
		float gradDxTrans[] =
		{
			sx.x()/2.0f,	sx.x()/2.0f,	0.f,	m_lookupSpec.minDX.x(),
			sx.y()/2.0f,	sx.y()/2.0f,	0.0f,	m_lookupSpec.minDX.y(),
			sx.z()/2.0f,	sx.z()/2.0f,	0.0f,	m_lookupSpec.minDX.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};
		float gradDyTrans[] =
		{
			-sy.x()/2.0f,	-sy.x()/2.0f,	0.f,	m_lookupSpec.maxDY.x(),
			-sy.y()/2.0f,	-sy.y()/2.0f,	0.0f,	m_lookupSpec.maxDY.y(),
			-sy.z()/2.0f,	-sy.z()/2.0f,	0.0f,	m_lookupSpec.maxDY.z(),
			0.0f,			0.0f,			0.0f,	0.0f
		};

		m_userAttribTransforms.push_back(tcu::Mat4(gradDxTrans));
		m_userAttribTransforms.push_back(tcu::Mat4(gradDyTrans));

		useAttribute(5u, A_IN1);
		useAttribute(6u, A_IN2);
	}

	initTexture();
}